

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5fce8::EvallingModuleRunner::EvallingModuleRunner
          (EvallingModuleRunner *this,Module *wasm,ExternalInterface *externalInterface,
          map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *linkedInstances_)

{
  _Rb_tree_header *p_Var1;
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  local_70;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_40;
  
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map(&local_70,linkedInstances_);
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = wasm;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.depth = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxLoopIterations = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.relaxedBehavior = NonConstant;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR__ModuleRunnerBase_0017fc80;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).wasm = wasm;
  p_Var1 = &(this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals._M_t
            ._M_impl.super__Rb_tree_header;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_40 = &(this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
              droppedDataSegments;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).multiValues.
  super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).multiValues.
  super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).multiValues.
  super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).callDepth = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).functionStack.
  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).functionStack.
  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).functionStack.
  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedDataSegments.
  _M_h._M_buckets =
       &(this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
        droppedDataSegments._M_h._M_single_bucket;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedDataSegments.
  _M_h._M_bucket_count = 1;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedDataSegments.
  _M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedDataSegments.
  _M_h._M_element_count = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedDataSegments.
  _M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedDataSegments.
  _M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedDataSegments.
  _M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedElementSegments
  ._M_h._M_buckets =
       &(this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
        droppedElementSegments._M_h._M_single_bucket;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedElementSegments
  ._M_h._M_bucket_count = 1;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedElementSegments
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedElementSegments
  ._M_h._M_element_count = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedElementSegments
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedElementSegments
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).droppedElementSegments
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).memorySizes._M_h.
  _M_buckets = &(this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
                memorySizes._M_h._M_single_bucket;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).memorySizes._M_h.
  _M_bucket_count = 1;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).memorySizes._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).memorySizes._M_h.
  _M_element_count = 0;
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).memorySizes._M_h.
  _M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).memorySizes.
          _M_h._M_rehash_policy._M_next_resize,0,0xd8);
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).externalInterface =
       externalInterface;
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map(&(this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).linkedInstances
        ,&local_70);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map(&local_70);
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR__ModuleRunnerBase_0017fc48;
  return;
}

Assistant:

EvallingModuleRunner(
    Module& wasm,
    ExternalInterface* externalInterface,
    std::map<Name, std::shared_ptr<EvallingModuleRunner>> linkedInstances_ = {})
    : ModuleRunnerBase(wasm, externalInterface, linkedInstances_) {}